

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::Clear(UniDirectionalLSTMLayerParams *this)

{
  ulong uVar1;
  LSTMParams *this_00;
  LSTMWeightParams *this_01;
  undefined8 *puVar2;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activations_).super_RepeatedPtrFieldBase);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) && (this_00 = this->params_, this_00 != (LSTMParams *)0x0)) {
    LSTMParams::~LSTMParams(this_00);
    operator_delete(this_00,0x20);
  }
  this->params_ = (LSTMParams *)0x0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_01 = this->weightparams_, this_01 != (LSTMWeightParams *)0x0)) {
    LSTMWeightParams::~LSTMWeightParams(this_01);
    operator_delete(this_01,0x90);
  }
  *(undefined8 *)((long)&this->inputvectorsize_ + 1) = 0;
  *(undefined8 *)((long)&this->outputvectorsize_ + 1) = 0;
  this->weightparams_ = (LSTMWeightParams *)0x0;
  this->inputvectorsize_ = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  activations_.Clear();
  if (GetArenaForAllocation() == nullptr && params_ != nullptr) {
    delete params_;
  }
  params_ = nullptr;
  if (GetArenaForAllocation() == nullptr && weightparams_ != nullptr) {
    delete weightparams_;
  }
  weightparams_ = nullptr;
  ::memset(&inputvectorsize_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&reverseinput_) -
      reinterpret_cast<char*>(&inputvectorsize_)) + sizeof(reverseinput_));
  _internal_metadata_.Clear<std::string>();
}